

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  ostringstream *poVar3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar5;
  Statement *pSVar6;
  ShaderExecutor *pSVar7;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar8;
  pointer pcVar9;
  double dVar10;
  pointer pMVar11;
  int iVar12;
  float afVar13 [2];
  Interval *pIVar14;
  IVal *pIVar15;
  MessageBuilder *pMVar16;
  undefined8 *puVar17;
  uint uVar18;
  Matrix<float,_2,_2> *pMVar19;
  long lVar20;
  FloatFormat *pFVar21;
  long lVar22;
  long lVar23;
  char *pcVar24;
  float afVar25 [2];
  float afVar26 [2];
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  *pBVar27;
  bool bVar28;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  IVal in0;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa78;
  undefined4 uStack_584;
  size_type local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  *local_568;
  IVal local_559;
  TestLog *local_558;
  size_t local_550;
  ulong local_548;
  undefined1 local_540 [16];
  undefined1 local_530 [24];
  double local_518;
  TestStatus *local_4e0;
  Matrix<float,_2,_2> *local_4d8;
  FloatFormat *local_4d0;
  long local_4c8;
  string local_4c0;
  Matrix<float,_2,_2> *local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  local_468;
  FloatFormat local_438;
  Matrix<float,_2,_2> local_408;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_3f8;
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  Interval IStack_380;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_368;
  undefined4 local_360;
  ios_base local_328 [8];
  ios_base local_320 [264];
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  Matrix<tcu::Interval,_2,_2> local_1a8;
  ios_base local_138 [264];
  
  this_00 = this->m_samplings;
  pFVar21 = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar5 = (this->m_caseCtx).numRandoms;
  local_4e0 = __return_storage_ptr__;
  iVar12 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_3f8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar21,(FloatFormat *)(ulong)PVar4,(Precision)sVar5,(ulong)(iVar12 + 0xdeadbeef),
             in_stack_fffffffffffffa78);
  pMVar11 = local_3f8.in0.
            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_550 = (long)local_3f8.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_3f8.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_468,local_550);
  local_438.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_438.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_438.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_438.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_438.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_438.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_438.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_438.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_438._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_558 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_3f8.in0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_210 = local_3f8.in1.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_3f8.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_3f8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_408.m_data.m_data[0].m_data =
       (float  [2])
       local_468.out0.
       super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_408.m_data.m_data[1].m_data =
       (float  [2])
       local_468.out1.
       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
       _M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_398 + 8);
  local_568 = this;
  local_398._0_8_ = local_558;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  afVar26 = (float  [2])((long)local_540 + 8);
  local_540._8_4_ = _S_red;
  local_530._0_4_ = 0.0;
  local_530._4_4_ = 0.0;
  local_518 = 0.0;
  pSVar6 = (local_568->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_530._8_8_ = afVar26;
  local_530._16_8_ = afVar26;
  local_4d0 = pFVar21;
  (*pSVar6->_vptr_Statement[4])(pSVar6,local_540);
  if ((float  [2])local_530._8_8_ != afVar26) {
    afVar13 = (float  [2])local_530._8_8_;
    do {
      (**(code **)(**(long **)((long)afVar13 + 0x20) + 0x30))
                (*(long **)((long)afVar13 + 0x20),&local_1a8);
      afVar13 = (float  [2])std::_Rb_tree_increment((_Rb_tree_node_base *)afVar13);
    } while (afVar13 != afVar26);
  }
  pFVar21 = local_4d0;
  if (local_518 != 0.0) {
    poVar3 = (ostringstream *)(local_398 + 8);
    local_398._0_8_ = local_558;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)CONCAT44(uStack_584,in_stack_fffffffffffffa78),local_580);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_584,in_stack_fffffffffffffa78) != &local_578) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_584,in_stack_fffffffffffffa78),
                      local_578._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_320);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_540);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pBVar27 = local_568;
  pSVar7 = (local_568->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pMVar19 = &local_408;
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,local_550,&local_218,pMVar19,0);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_398);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(&local_1a8);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_540);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_498,
             (pBVar27->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_398);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_498,
             (pBVar27->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             &local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar27->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa78);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar27->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c0);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_498,
             (pBVar27->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_540);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar27->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_559);
  if (local_3f8.in0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar11) {
    local_548 = 0;
  }
  else {
    local_4a0 = (Matrix<float,_2,_2> *)(local_550 + (local_550 == 0));
    local_4d8 = (Matrix<float,_2,_2> *)0x0;
    local_548 = 0;
    do {
      tcu::Matrix<tcu::Interval,_2,_2>::Matrix(&local_1a8);
      local_4c8 = (long)local_4d8 * 0x10;
      round<tcu::Matrix<float,2,2>>
                ((IVal *)local_540,(shaderexecutor *)pFVar21,
                 (FloatFormat *)
                 (local_3f8.in0.
                  super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)local_4d8),pMVar19);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_398,pFVar21,(IVal *)local_540);
      pIVar14 = (Interval *)
                Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_498,
                           (pBVar27->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      pMVar16 = (MessageBuilder *)local_398;
      lVar20 = 0;
      do {
        lVar22 = 0;
        do {
          *(undefined8 *)((long)&pIVar14->m_hi + lVar22) =
               *(undefined8 *)(&pMVar16->field_0x10 + lVar22);
          puVar17 = (undefined8 *)((long)&pMVar16->m_log + lVar22);
          dVar10 = (double)puVar17[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)&pIVar14->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar22;
          *(undefined8 *)pbVar2 = *puVar17;
          *(double *)(pbVar2 + 8) = dVar10;
          lVar22 = lVar22 + 0x30;
        } while (lVar22 == 0x30);
        pIVar14 = pIVar14 + 1;
        pMVar16 = (MessageBuilder *)&pMVar16->field_0x18;
        bVar28 = lVar20 == 0;
        lVar20 = lVar20 + 1;
      } while (bVar28);
      round<tcu::Matrix<float,2,2>>
                ((IVal *)local_540,(shaderexecutor *)pFVar21,
                 (FloatFormat *)
                 ((long)((local_3f8.in1.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                 local_4c8),(Matrix<float,_2,_2> *)pMVar16);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_398,pFVar21,(IVal *)local_540);
      pIVar14 = (Interval *)
                Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_498,
                           (pBVar27->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      lVar20 = local_4c8;
      pMVar16 = (MessageBuilder *)local_398;
      lVar22 = 0;
      do {
        lVar23 = 0;
        do {
          *(undefined8 *)((long)&pIVar14->m_hi + lVar23) =
               *(undefined8 *)(&pMVar16->field_0x10 + lVar23);
          puVar17 = (undefined8 *)((long)&pMVar16->m_log + lVar23);
          dVar10 = (double)puVar17[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)&pIVar14->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar23;
          *(undefined8 *)pbVar2 = *puVar17;
          *(double *)(pbVar2 + 8) = dVar10;
          lVar23 = lVar23 + 0x30;
        } while (lVar23 == 0x30);
        pIVar14 = pIVar14 + 1;
        pMVar16 = (MessageBuilder *)&pMVar16->field_0x18;
        bVar28 = lVar22 == 0;
        lVar22 = lVar22 + 1;
      } while (bVar28);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar27->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar27->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      IStack_380.m_hi._0_4_ = (pBVar27->m_caseCtx).precision;
      IStack_380.m_lo = pFVar21->m_maxValue;
      local_398._0_8_ = *(undefined8 *)pFVar21;
      local_398._8_4_ = pFVar21->m_fractionBits;
      local_398._12_4_ = pFVar21->m_hasSubnormal;
      local_388._0_4_ = pFVar21->m_hasInf;
      local_388._4_4_ = pFVar21->m_hasNaN;
      IStack_380.m_hasNaN = pFVar21->m_exactPrecision;
      IStack_380._1_3_ = *(undefined3 *)&pFVar21->field_0x19;
      IStack_380._4_4_ = *(undefined4 *)&pFVar21->field_0x1c;
      local_360 = 0;
      pSVar6 = (pBVar27->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_368 = &local_498;
      (*pSVar6->_vptr_Statement[3])(pSVar6,(MessageBuilder *)local_398);
      pIVar15 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_498,
                           (pBVar27->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_398,&local_438,pIVar15);
      pIVar14 = (Interval *)&local_1a8;
      pMVar16 = (MessageBuilder *)local_398;
      lVar22 = 0;
      do {
        lVar23 = 0;
        do {
          *(undefined8 *)((long)&pIVar14->m_hi + lVar23) =
               *(undefined8 *)(&pMVar16->field_0x10 + lVar23);
          puVar17 = (undefined8 *)((long)&pMVar16->m_log + lVar23);
          dVar10 = (double)puVar17[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)&pIVar14->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar23;
          *(undefined8 *)pbVar2 = *puVar17;
          *(double *)(pbVar2 + 8) = dVar10;
          lVar23 = lVar23 + 0x30;
        } while (lVar23 == 0x30);
        pIVar14 = pIVar14 + 1;
        pMVar16 = (MessageBuilder *)&pMVar16->field_0x18;
        bVar28 = lVar22 == 0;
        lVar22 = lVar22 + 1;
      } while (bVar28);
      poVar3 = (ostringstream *)(local_398 + 8);
      bVar28 = contains<tcu::Matrix<float,2,2>>
                         (&local_1a8,
                          (Matrix<float,_2,_2> *)
                          ((long)local_468.out0.
                                 super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar20));
      local_398._0_8_ = local_388;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_398,"Shader output 0 is outside acceptable range","");
      bVar28 = tcu::ResultCollector::check(&local_1f8,bVar28,(string *)local_398);
      if ((TestLog *)local_398._0_8_ != (TestLog *)local_388) {
        operator_delete((void *)local_398._0_8_,CONCAT44(local_388._4_4_,local_388._0_4_) + 1);
      }
      uVar18 = (int)local_548 + ((byte)~bVar28 & 1);
      local_548 = (ulong)uVar18;
      if ((int)uVar18 < 0x65 && !bVar28) {
        local_398._0_8_ = local_558;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        pcVar24 = "Failed";
        if (bVar28) {
          pcVar24 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar24,6);
        pFVar21 = local_4d0;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar8 = (local_568->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                 m_ptr;
        pMVar19 = (Matrix<float,_2,_2> *)local_530;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_540._0_8_ = pMVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)&local_438,
                   (FloatFormat *)
                   ((long)((local_3f8.in0.
                            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar20),pMVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(uStack_584,in_stack_fffffffffffffa78),
                   local_580);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_584,in_stack_fffffffffffffa78) != &local_578) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_584,in_stack_fffffffffffffa78),
                          local_578._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_2,_2> *)local_540._0_8_ != (Matrix<float,_2,_2> *)local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar8 = (local_568->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                 m_ptr;
        pMVar19 = (Matrix<float,_2,_2> *)local_530;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_540._0_8_ = pMVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)&local_438,
                   (FloatFormat *)
                   ((long)((local_3f8.in1.
                            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar20),pMVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(uStack_584,in_stack_fffffffffffffa78),
                   local_580);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_584,in_stack_fffffffffffffa78) != &local_578) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_584,in_stack_fffffffffffffa78),
                          local_578._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_2,_2> *)local_540._0_8_ != (Matrix<float,_2,_2> *)local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar8 = (local_568->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                 m_ptr;
        pIVar15 = (IVal *)local_530;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_540._0_8_ = pIVar15;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)&local_438,
                   (FloatFormat *)
                   (lVar20 + (long)local_468.out0.
                                   super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start),
                   (Matrix<float,_2,_2> *)pIVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(uStack_584,in_stack_fffffffffffffa78),
                   local_580);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_4c0,(shaderexecutor *)&local_438,(FloatFormat *)&local_1a8,pIVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_584,in_stack_fffffffffffffa78) != &local_578) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_584,in_stack_fffffffffffffa78),
                          local_578._M_allocated_capacity + 1);
        }
        if ((IVal *)local_540._0_8_ != (IVal *)local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_320);
      }
      pMVar19 = (Matrix<float,_2,_2> *)((long)(local_4d8->m_data).m_data[0].m_data + 1);
      pBVar27 = local_568;
      local_4d8 = pMVar19;
    } while (pMVar19 != local_4a0);
  }
  iVar12 = (int)local_548;
  if (100 < iVar12) {
    poVar3 = (ostringstream *)(local_398 + 8);
    local_398._0_8_ = local_558;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar12 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_320);
  }
  poVar3 = (ostringstream *)(local_398 + 8);
  if (iVar12 == 0) {
    local_398._0_8_ = local_558;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_398._0_8_ = local_558;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_320);
  if (iVar12 == 0) {
    local_398._0_8_ = (IVal *)local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Pass","");
    local_4e0->m_code = QP_TEST_RESULT_PASS;
    (local_4e0->m_description)._M_dataplus._M_p = (pointer)&(local_4e0->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e0->m_description,local_398._0_8_,
               (long)&((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)local_398._0_8_)->m_data[0].
                      m_data[0].m_hasNaN + CONCAT44(local_398._12_4_,local_398._8_4_));
    if ((IVal *)local_398._0_8_ == (IVal *)local_388) goto LAB_008f70a7;
    afVar26[1] = (float)local_388._4_4_;
    afVar26[0] = (float)local_388._0_4_;
    pIVar15 = (IVal *)local_398._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
    std::ostream::operator<<(local_398,iVar12);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
    std::ios_base::~ios_base(local_328);
    local_398._0_8_ = (IVal *)local_388;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398," test failed. Check log for the details","");
    afVar26 = (float  [2])
              (CONCAT44(local_398._12_4_,local_398._8_4_) +
              CONCAT44(local_540._12_4_,local_540._8_4_));
    afVar13[0] = 2.10195e-44;
    afVar13[1] = 0.0;
    if ((IVal *)local_540._0_8_ != (IVal *)local_530) {
      afVar13 = (float  [2])local_530._0_8_;
    }
    if ((ulong)afVar13 < (ulong)afVar26) {
      afVar25[0] = 2.10195e-44;
      afVar25[1] = 0.0;
      if ((IVal *)local_398._0_8_ != (IVal *)local_388) {
        afVar25[1] = (float)local_388._4_4_;
        afVar25[0] = (float)local_388._0_4_;
      }
      if ((ulong)afVar25 < (ulong)afVar26) goto LAB_008f6f2e;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_398,0,(char *)0x0,local_540._0_8_);
    }
    else {
LAB_008f6f2e:
      puVar17 = (undefined8 *)std::__cxx11::string::_M_append(local_540,local_398._0_8_);
    }
    local_1a8.m_data.m_data[0].m_data[0]._0_8_ = &local_1a8.m_data.m_data[0].m_data[0].m_hi;
    pdVar1 = (double *)(puVar17 + 2);
    if ((double *)*puVar17 == pdVar1) {
      local_1a8.m_data.m_data[0].m_data[0].m_hi = *pdVar1;
      local_1a8.m_data.m_data[0].m_data[1]._0_4_ = *(undefined4 *)(puVar17 + 3);
      local_1a8.m_data.m_data[0].m_data[1]._4_4_ = *(undefined4 *)((long)puVar17 + 0x1c);
    }
    else {
      local_1a8.m_data.m_data[0].m_data[0].m_hi = *pdVar1;
      local_1a8.m_data.m_data[0].m_data[0]._0_8_ = (double *)*puVar17;
    }
    local_1a8.m_data.m_data[0].m_data[0].m_lo = (double)puVar17[1];
    *puVar17 = pdVar1;
    puVar17[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    local_4e0->m_code = QP_TEST_RESULT_FAIL;
    (local_4e0->m_description)._M_dataplus._M_p = (pointer)&(local_4e0->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e0->m_description,local_1a8.m_data.m_data[0].m_data[0]._0_8_,
               (undefined1 *)
               ((long)local_1a8.m_data.m_data[0].m_data[0].m_lo +
               local_1a8.m_data.m_data[0].m_data[0]._0_8_));
    if ((double *)local_1a8.m_data.m_data[0].m_data[0]._0_8_ !=
        &local_1a8.m_data.m_data[0].m_data[0].m_hi) {
      operator_delete((void *)local_1a8.m_data.m_data[0].m_data[0]._0_8_,
                      (long)local_1a8.m_data.m_data[0].m_data[0].m_hi + 1);
    }
    if ((IVal *)local_398._0_8_ != (IVal *)local_388) {
      operator_delete((void *)local_398._0_8_,CONCAT44(local_388._4_4_,local_388._0_4_) + 1);
    }
    afVar26 = (float  [2])local_530._0_8_;
    pIVar15 = (IVal *)local_540._0_8_;
    if ((IVal *)local_540._0_8_ == (IVal *)local_530) goto LAB_008f70a7;
  }
  operator_delete(pIVar15,(ulong)((long)afVar26 + 1));
LAB_008f70a7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if ((float  [2])
      local_468.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (float  [2])0x0) {
    operator_delete(local_468.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((float  [2])
      local_468.out0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (float  [2])0x0) {
    operator_delete(local_468.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f8.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f8.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f8.in1.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.in1.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f8.in1.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.in1.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f8.in0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f8.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_4e0;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}